

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  undefined8 extraout_RAX;
  String *this_00;
  FilePath output_dir;
  FilePath output_file;
  FilePath local_38;
  FilePath local_28;
  
  this_00 = &this->output_file_;
  FilePath::FilePath(&local_28,this_00);
  FilePath::RemoveFileName(&local_38);
  bVar1 = FilePath::CreateDirectoriesRecursively(&local_38);
  if (bVar1) {
    __stream = fopen(this_00->c_str_,"w");
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (__stream != (FILE *)0x0) {
    PrintXmlUnitTest((FILE *)__stream,unit_test);
    fclose(__stream);
    if (local_38.pathname_.c_str_ != (char *)0x0) {
      operator_delete__(local_38.pathname_.c_str_);
    }
    if (local_28.pathname_.c_str_ != (char *)0x0) {
      operator_delete__(local_28.pathname_.c_str_);
    }
    return;
  }
  OnTestIterationEnd((XmlUnitTestResultPrinter *)this_00);
  if (local_28.pathname_.c_str_ != (char *)0x0) {
    operator_delete__(local_28.pathname_.c_str_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            output_file_.c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  PrintXmlUnitTest(xmlout, unit_test);
  fclose(xmlout);
}